

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

CURLcode Curl_conn_connect(Curl_easy *data,int sockindex,_Bool blocking,_Bool *done)

{
  Curl_cfilter *cf;
  curl_trc_feat *pcVar1;
  connectdata *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  curl_socket_t sock;
  uint uVar5;
  ulong uVar6;
  ulong timeout_ms;
  Curl_easy *data_00;
  void *in_R9;
  curltime cVar7;
  curl_pollfds cpfds;
  easy_pollset ps;
  pollfd a_few_on_stack [5];
  
  cf = data->conn->cfilter[sockindex];
  if (cf == (Curl_cfilter *)0x0) {
    CVar4 = CURLE_FAILED_INIT;
    *done = false;
  }
  else {
    CVar4 = CURLE_OK;
    _Var3 = (_Bool)(cf->field_0x24 & 1);
    *done = _Var3;
    if (_Var3 == false) {
      Curl_pollfds_init(&cpfds,a_few_on_stack,5);
      do {
        if (*done != false) {
LAB_00118581:
          CVar4 = CURLE_OK;
          goto LAB_0011863e;
        }
        _Var3 = Curl_conn_needs_flush(data,sockindex);
        if (((_Var3) && (CVar4 = Curl_conn_flush(data,sockindex), CVar4 != CURLE_AGAIN)) &&
           (CVar4 != CURLE_OK)) {
          return CVar4;
        }
        CVar4 = (*(code *)cf->cft->do_connect)(cf,data,done);
        if (((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < cf->cft->log_level)) {
          in_R9 = (void *)(ulong)*done;
          Curl_trc_cf_infof(data,cf,"Curl_conn_connect(block=%d) -> %d, done=%d",(ulong)blocking);
        }
        if (CVar4 != CURLE_OK) {
          if (((((data->set).field_0x89f & 0x40) != 0) &&
              ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
               (0 < pcVar1->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"Curl_conn_connect(), filter returned %d",(ulong)CVar4);
          }
          conn_report_connect_stats(data,data->conn);
          goto LAB_0011863e;
        }
        if (*done == true) {
          CVar4 = CURLE_OK;
          cf_cntrl_all(data->conn,data,true,0x100,0,in_R9);
          conn_report_connect_stats(data,data->conn);
          pcVar2 = data->conn;
          cVar7 = Curl_now();
          (pcVar2->keepalive).tv_sec = cVar7.tv_sec;
          (pcVar2->keepalive).tv_usec = cVar7.tv_usec;
          Curl_verboseconnect(data,data->conn,sockindex);
          goto LAB_0011863e;
        }
        if (!blocking) goto LAB_00118581;
        uVar6 = Curl_timeleft(data,(curltime *)0x0,true);
        sock = Curl_conn_cf_get_socket(cf,data);
        if ((long)uVar6 < 0) {
          Curl_failf(data,"connect timeout");
          CVar4 = CURLE_OPERATION_TIMEDOUT;
          goto LAB_0011863e;
        }
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ) && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"Curl_conn_connect(block=1), do poll");
        }
        data_00 = (Curl_easy *)&cpfds;
        Curl_pollfds_reset(&cpfds);
        ps.sockets[4] = 0;
        ps.num = 0;
        ps.actions[0] = '\0';
        ps.actions[1] = '\0';
        ps.actions[2] = '\0';
        ps.actions[3] = '\0';
        ps.actions[4] = '\0';
        ps._29_3_ = 0;
        ps.sockets[0] = 0;
        ps.sockets[1] = 0;
        ps.sockets[2] = 0;
        ps.sockets[3] = 0;
        if (sock != -1) {
          Curl_pollset_change(data_00,&ps,sock,2,1);
        }
        Curl_conn_adjust_pollset(data,data->conn,&ps);
        CVar4 = Curl_pollfds_add_ps(&cpfds,&ps);
        if (CVar4 != CURLE_OK) goto LAB_0011863e;
        timeout_ms = 1000;
        if (cpfds.n == 0) {
          timeout_ms = 10;
        }
        if (uVar6 < timeout_ms) {
          timeout_ms = uVar6;
        }
        uVar5 = Curl_poll(cpfds.pfds,cpfds.n,timeout_ms);
        if (((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"Curl_conn_connect(block=1), Curl_poll() -> %d",(ulong)uVar5);
        }
      } while (-1 < (int)uVar5);
      CVar4 = CURLE_COULDNT_CONNECT;
LAB_0011863e:
      Curl_pollfds_cleanup(&cpfds);
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_conn_connect(struct Curl_easy *data,
                           int sockindex,
                           bool blocking,
                           bool *done)
{
#define CF_CONN_NUM_POLLS_ON_STACK 5
  struct pollfd a_few_on_stack[CF_CONN_NUM_POLLS_ON_STACK];
  struct curl_pollfds cpfds;
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  if(!cf) {
    *done = FALSE;
    return CURLE_FAILED_INIT;
  }

  *done = cf->connected;
  if(*done)
    return CURLE_OK;

  Curl_pollfds_init(&cpfds, a_few_on_stack, CF_CONN_NUM_POLLS_ON_STACK);
  while(!*done) {
    if(Curl_conn_needs_flush(data, sockindex)) {
      DEBUGF(infof(data, "Curl_conn_connect(index=%d), flush", sockindex));
      result = Curl_conn_flush(data, sockindex);
      if(result && (result != CURLE_AGAIN))
        return result;
    }

    result = cf->cft->do_connect(cf, data, done);
    CURL_TRC_CF(data, cf, "Curl_conn_connect(block=%d) -> %d, done=%d",
                blocking, result, *done);
    if(!result && *done) {
      /* Now that the complete filter chain is connected, let all filters
       * persist information at the connection. E.g. cf-socket sets the
       * socket and ip related information. */
      cf_cntrl_update_info(data, data->conn);
      conn_report_connect_stats(data, data->conn);
      data->conn->keepalive = Curl_now();
      Curl_verboseconnect(data, data->conn, sockindex);
      goto out;
    }
    else if(result) {
      CURL_TRC_CF(data, cf, "Curl_conn_connect(), filter returned %d",
                  result);
      conn_report_connect_stats(data, data->conn);
      goto out;
    }

    if(!blocking)
      goto out;
    else {
      /* check allowed time left */
      const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
      curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
      struct easy_pollset ps;
      int rc;

      if(timeout_ms < 0) {
        /* no need to continue if time already is up */
        failf(data, "connect timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }

      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), do poll");
      Curl_pollfds_reset(&cpfds);
      memset(&ps, 0, sizeof(ps));
      /* In general, we want to send after connect, wait on that. */
      if(sockfd != CURL_SOCKET_BAD)
        Curl_pollset_set_out_only(data, &ps, sockfd);
      Curl_conn_adjust_pollset(data, data->conn, &ps);
      result = Curl_pollfds_add_ps(&cpfds, &ps);
      if(result)
        goto out;

      rc = Curl_poll(cpfds.pfds, cpfds.n,
                     CURLMIN(timeout_ms, (cpfds.n ? 1000 : 10)));
      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), Curl_poll() -> %d",
                  rc);
      if(rc < 0) {
        result = CURLE_COULDNT_CONNECT;
        goto out;
      }
      /* continue iterating */
    }
  }

out:
  Curl_pollfds_cleanup(&cpfds);
  return result;
}